

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerLdArrHead(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  RegOpnd *baseOpnd;
  bool bVar2;
  ObjectType OVar3;
  uint32 offset;
  Opnd *pOVar4;
  undefined4 *puVar5;
  IndirOpnd *newSrc;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_22;
  RegOpnd *pRStack_20;
  ValueType arrayValueType;
  RegOpnd *array;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar4 = IR::Instr::UnlinkSrc1(instr);
  pRStack_20 = IR::Opnd::AsRegOpnd(pOVar4);
  local_22.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRStack_20->super_Opnd);
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_22.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2c77,"(arrayValueType.IsAnyOptimizedArray())",
                       "arrayValueType.IsAnyOptimizedArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  OVar3 = ValueType::GetObjectType((ValueType *)&local_22.field_0);
  if (OVar3 == ObjectWithArray) {
    pRStack_20 = LoadObjectArray(this,pRStack_20,instr);
  }
  pOVar4 = IR::Instr::GetDst(instr);
  IR::Opnd::SetType(pOVar4,TyUint64);
  baseOpnd = pRStack_20;
  offset = GetArrayOffsetOfHeadSegment((ValueType)local_22.field_0);
  newSrc = IR::IndirOpnd::New(baseOpnd,offset,TyUint64,instr->m_func,false);
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  LowererMD::ChangeToAssign(instr);
  return;
}

Assistant:

void Lowerer::LowerLdArrHead(IR::Instr *const instr)
{
    IR::RegOpnd *array = instr->UnlinkSrc1()->AsRegOpnd();
    const ValueType arrayValueType(array->GetValueType());
    Assert(arrayValueType.IsAnyOptimizedArray());

    if(arrayValueType.GetObjectType() == ObjectType::ObjectWithArray)
    {
        array = LoadObjectArray(array, instr);
    }

    // mov arrayHeadSegment, [array + offset(headSegment)]
    instr->GetDst()->SetType(TyMachPtr);
    instr->SetSrc1(
        IR::IndirOpnd::New(
            array,
            GetArrayOffsetOfHeadSegment(arrayValueType),
            TyMachPtr,
            instr->m_func));
    LowererMD::ChangeToAssign(instr);
}